

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# external_frame_buffer_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_79f906::ExternalFrameBufferNonRefTest::SetUp(ExternalFrameBufferNonRefTest *this)

{
  aom_codec_dec_cfg_t cfg_00;
  bool bVar1;
  char *file;
  AV1Decoder **val1;
  AssertHelper *this_00;
  undefined8 in_RDI;
  AssertionResult gtest_ar_1;
  aom_codec_dec_cfg_t cfg;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  IVFVideoSource *in_stack_ffffffffffffff20;
  undefined4 uVar2;
  int line;
  allocator *paVar3;
  Type type;
  AssertHelper *in_stack_ffffffffffffff40;
  AssertionResult local_a8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Message *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint uVar4;
  AssertionResult local_50;
  undefined1 local_3d;
  allocator local_29;
  string local_28 [40];
  
  uVar2 = (undefined4)in_RDI;
  line = (int)((ulong)in_RDI >> 0x20);
  file = (char *)operator_new(0x48);
  local_3d = 1;
  paVar3 = &local_29;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,"av1-1-b8-01-size-226x226.ivf",paVar3);
  type = (Type)((ulong)paVar3 >> 0x20);
  libaom_test::IVFVideoSource::IVFVideoSource(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  local_3d = 0;
  *(char **)(CONCAT44(line,uVar2) + 0x10) = file;
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  testing::internal::CmpHelperNE<libaom_test::CompressedVideoSource*,decltype(nullptr)>
            ((char *)CONCAT44(line,uVar2),(char *)in_stack_ffffffffffffff20,
             (CompressedVideoSource **)in_stack_ffffffffffffff18,&in_stack_ffffffffffffff10->data_);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_50);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff40);
    in_stack_ffffffffffffff20 =
         (IVFVideoSource *)testing::AssertionResult::failure_message((AssertionResult *)0x7162ff);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff40,type,file,line,(char *)in_stack_ffffffffffffff20);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               in_stack_ffffffffffffff88);
    testing::internal::AssertHelper::~AssertHelper(in_stack_ffffffffffffff10);
    testing::Message::~Message((Message *)0x71635c);
  }
  uVar4 = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x7163e3);
  if (uVar4 == 0) {
    (**(code **)(**(long **)(CONCAT44(line,uVar2) + 0x10) + 0x10))();
    (**(code **)(**(long **)(CONCAT44(line,uVar2) + 0x10) + 0x18))();
    local_88 = 0;
    uStack_80 = 0x100000000;
    val1 = (AV1Decoder **)operator_new(0x60);
    local_98 = local_88;
    uStack_90 = uStack_80;
    cfg_00.w = line;
    cfg_00.threads = uVar2;
    cfg_00._8_8_ = file;
    libaom_test::AV1Decoder::AV1Decoder
              ((AV1Decoder *)in_stack_ffffffffffffff20,cfg_00,(aom_codec_flags_t)val1);
    *(AV1Decoder ***)(CONCAT44(line,uVar2) + 0x18) = val1;
    testing::internal::CmpHelperNE<libaom_test::AV1Decoder*,decltype(nullptr)>
              ((char *)CONCAT44(line,uVar2),(char *)in_stack_ffffffffffffff20,val1,
               &in_stack_ffffffffffffff10->data_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a8);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_ffffffffffffff40);
      this_00 = (AssertHelper *)
                testing::AssertionResult::failure_message((AssertionResult *)0x7164f5);
      testing::internal::AssertHelper::AssertHelper
                (in_stack_ffffffffffffff40,type,file,line,(char *)in_stack_ffffffffffffff20);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)CONCAT44(uVar4,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
                );
      testing::internal::AssertHelper::~AssertHelper(this_00);
      testing::Message::~Message((Message *)0x716543);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x7165bb);
  }
  return;
}

Assistant:

void SetUp() override {
    video_ = new libaom_test::IVFVideoSource(kAV1NonRefTestFile);
    ASSERT_NE(video_, nullptr);
    video_->Init();
    video_->Begin();

    aom_codec_dec_cfg_t cfg = aom_codec_dec_cfg_t();
    cfg.allow_lowbitdepth = !FORCE_HIGHBITDEPTH_DECODING;
    decoder_ = new libaom_test::AV1Decoder(cfg, 0);
    ASSERT_NE(decoder_, nullptr);
  }